

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.cpp
# Opt level: O3

bool __thiscall Screen::endAnimation(Screen *this)

{
  pointer pcVar1;
  string local_38;
  
  wclear(this->animationScreen);
  wrefresh(this->animationScreen);
  delwin(this->animationScreen);
  this->animationMode = false;
  updateInfo(this);
  pcVar1 = (this->currentText)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->currentText)._M_string_length);
  displayText(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool Screen::endAnimation() {
    // Clear out the window's data structure
    wclear(animationScreen);
    wrefresh(animationScreen);

    // Delete the window
    delwin(animationScreen);

    // Turn off animation mode
    animationMode = false;

    // Replace the screen contents
    updateInfo();

    displayText(currentText);

    return true;
}